

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O1

bool rcg::saveStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  long lVar1;
  CFeatureBag bag;
  ofstream out;
  CFeatureBag aCStack_228 [16];
  long local_218;
  filebuf local_210 [20];
  undefined4 auStack_1fc [55];
  ios_base local_120 [264];
  
  GenApi_3_4::CFeatureBag::CFeatureBag(aCStack_228);
  GenApi_3_4::CFeatureBag::StoreToBag
            ((INodeMap *)aCStack_228,
             (int)(((nodemap->
                    super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,
             (gcstring_vector *)0xffffffff);
  std::ofstream::ofstream(&local_218);
  lVar1 = *(long *)(local_218 + -0x18);
  *(undefined4 *)((long)auStack_1fc + lVar1) = 5;
  std::ios::clear((int)aCStack_228 + (int)lVar1 + 0x10);
  std::ofstream::open((char *)&local_218,(_Ios_Openmode)name);
  GenApi_3_4::operator<<((ostream *)&local_218,aCStack_228);
  std::ofstream::close();
  local_218 = _VTT;
  *(undefined8 *)(local_210 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
  std::filebuf::~filebuf(local_210);
  std::ios_base::~ios_base(local_120);
  GenApi_3_4::CFeatureBag::~CFeatureBag(aCStack_228);
  return true;
}

Assistant:

bool saveStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    bag.StoreToBag(nodemap->_Ptr);

    std::ofstream out;
    out.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    out.open(name);
    out << bag;
    out.close();

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}